

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_vfy.cc
# Opt level: O0

X509 * lookup_cert_match(X509_STORE_CTX *ctx,X509 *x)

{
  int iVar1;
  X509_NAME *nm;
  stack_st_X509 *sk;
  size_t sVar2;
  ulong local_38;
  size_t i;
  X509 *xtmp;
  stack_st_X509 *certs;
  X509 *x_local;
  X509_STORE_CTX *ctx_local;
  
  i = 0;
  nm = (X509_NAME *)X509_get_subject_name((X509 *)x);
  sk = X509_STORE_CTX_get1_certs(ctx,nm);
  if (sk == (stack_st_X509 *)0x0) {
    ctx_local = (X509_STORE_CTX *)0x0;
  }
  else {
    for (local_38 = 0; sVar2 = sk_X509_num(sk), local_38 < sVar2; local_38 = local_38 + 1) {
      i = (size_t)sk_X509_value(sk,local_38);
      iVar1 = X509_cmp((X509 *)i,(X509 *)x);
      if (iVar1 == 0) break;
    }
    sVar2 = sk_X509_num(sk);
    if (local_38 < sVar2) {
      X509_up_ref((X509 *)i);
    }
    else {
      i = 0;
    }
    sk_X509_pop_free(sk,X509_free);
    ctx_local = (X509_STORE_CTX *)i;
  }
  return (X509 *)ctx_local;
}

Assistant:

static X509 *lookup_cert_match(X509_STORE_CTX *ctx, X509 *x) {
  STACK_OF(X509) *certs;
  X509 *xtmp = NULL;
  size_t i;
  // Lookup all certs with matching subject name
  certs = X509_STORE_CTX_get1_certs(ctx, X509_get_subject_name(x));
  if (certs == NULL) {
    return NULL;
  }
  // Look for exact match
  for (i = 0; i < sk_X509_num(certs); i++) {
    xtmp = sk_X509_value(certs, i);
    if (!X509_cmp(xtmp, x)) {
      break;
    }
  }
  if (i < sk_X509_num(certs)) {
    X509_up_ref(xtmp);
  } else {
    xtmp = NULL;
  }
  sk_X509_pop_free(certs, X509_free);
  return xtmp;
}